

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void event_base_del_virtual_(event_base *base)

{
  unsigned_long uVar1;
  int iVar2;
  unsigned_long uVar3;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (0 < base->virtual_event_count) {
    iVar2 = base->virtual_event_count + -1;
    base->virtual_event_count = iVar2;
    if ((evthread_id_fn_ != (_func_unsigned_long *)0x0 && iVar2 == 0) && (base->running_loop != 0))
    {
      uVar1 = base->th_owner_id;
      uVar3 = (*evthread_id_fn_)();
      if (uVar1 != uVar3) {
        evthread_notify_base(base);
      }
    }
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
      return;
    }
    return;
  }
  event_base_del_virtual__cold_1();
}

Assistant:

void
event_base_del_virtual_(struct event_base *base)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	EVUTIL_ASSERT(base->virtual_event_count > 0);
	base->virtual_event_count--;
	if (base->virtual_event_count == 0 && EVBASE_NEED_NOTIFY(base))
		evthread_notify_base(base);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}